

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

double free_format_parser::getWallTime(void)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  return (double)lVar1 / 1000000000.0;
}

Assistant:

double getWallTime() {
  using namespace std::chrono;
  const double wall_time = kNoClockCalls
                               ? 0
                               : duration_cast<duration<double> >(
                                     wall_clock::now().time_since_epoch())
                                     .count();
  return wall_time;
}